

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O1

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  short sVar2;
  stbi__uint32 sVar3;
  stbi__uint32 b;
  long lVar4;
  short sVar5;
  bool bVar6;
  stbi_uc sVar7;
  byte bVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  stbi_uc sVar11;
  byte bVar12;
  char cVar13;
  uchar uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  stbi__jpeg *j;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  void *pvVar22;
  void *pvVar23;
  code *pcVar24;
  undefined8 *puVar25;
  int iVar26;
  undefined8 *puVar27;
  uint extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  int why;
  int why_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  anon_struct_96_18_0d0905d3 *extraout_RDX_04;
  anon_struct_96_18_0d0905d3 *extraout_RDX_05;
  anon_struct_96_18_0d0905d3 *extraout_RDX_06;
  anon_struct_96_18_0d0905d3 *extraout_RDX_07;
  anon_struct_96_18_0d0905d3 *extraout_RDX_08;
  anon_struct_96_18_0d0905d3 *extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  anon_struct_96_18_0d0905d3 *extraout_RDX_14;
  anon_struct_96_18_0d0905d3 *paVar28;
  stbi__context *psVar29;
  stbi__context *extraout_RDX_15;
  stbi__context *extraout_RDX_16;
  stbi__context *extraout_RDX_17;
  stbi__context *extraout_RDX_18;
  stbi__context *extraout_RDX_19;
  stbi__context *extraout_RDX_20;
  stbi__context *extraout_RDX_21;
  stbi__context *extraout_RDX_22;
  undefined8 extraout_RDX_23;
  undefined8 extraout_RDX_24;
  undefined8 uVar30;
  stbi_uc *extraout_RDX_25;
  stbi_uc *extraout_RDX_26;
  stbi_uc *psVar31;
  ulong uVar32;
  short *psVar33;
  long lVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  stbi_uc *psVar39;
  int iVar40;
  uint uVar41;
  int *piVar42;
  ulong uVar43;
  stbi__context *psVar44;
  stbi_uc **ppsVar45;
  long in_FS_OFFSET;
  bool bVar46;
  undefined1 auVar47 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_1a4;
  ulong local_190;
  int local_170;
  stbi_uc *local_138 [3];
  long lStack_120;
  anon_struct_96_18_0d0905d3 *local_118;
  long local_110;
  stbi__uint32 *local_108;
  stbi__uint32 *local_100;
  short local_f8 [4];
  long local_f0 [2];
  int local_e0 [44];
  
  j = (stbi__jpeg *)malloc(0x4888);
  if (j == (stbi__jpeg *)0x0) {
    *(char **)(in_FS_OFFSET + -8) = "outofmem";
    return (void *)0x0;
  }
  memset(j,0,0x4888);
  j->s = s;
  j->idct_block_kernel = stbi__idct_simd;
  j->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  j->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  s->img_n = 0;
  paVar1 = j->img_comp;
  lVar19 = 0x46d8;
  do {
    psVar31 = j->huff_dc[0].fast + lVar19 + -8;
    psVar31[0] = '\0';
    psVar31[1] = '\0';
    psVar31[2] = '\0';
    psVar31[3] = '\0';
    psVar31[4] = '\0';
    psVar31[5] = '\0';
    psVar31[6] = '\0';
    psVar31[7] = '\0';
    psVar31[8] = '\0';
    psVar31[9] = '\0';
    psVar31[10] = '\0';
    psVar31[0xb] = '\0';
    psVar31[0xc] = '\0';
    psVar31[0xd] = '\0';
    psVar31[0xe] = '\0';
    psVar31[0xf] = '\0';
    lVar19 = lVar19 + 0x60;
  } while (lVar19 != 0x4858);
  j->restart_interval = 0;
  j->jfif = 0;
  j->app14_color_transform = -1;
  j->marker = 0xff;
  sVar7 = stbi__get_marker(j);
  if (sVar7 != 0xd8) {
    pcVar20 = "no SOI";
    paVar28 = extraout_RDX;
    goto LAB_001327fb;
  }
  bVar8 = stbi__get_marker(j);
  uVar35 = (uint)bVar8;
  if (bVar8 != 0xc2 && (uVar35 & 0xfffffffe) != 0xc0) {
    do {
      iVar15 = stbi__process_marker(j,uVar35);
      uVar35 = extraout_EDX;
      if (iVar15 == 0) goto LAB_00132804;
LAB_001326aa:
      bVar8 = stbi__get_marker(j);
      if (bVar8 == 0xff) {
        psVar29 = j->s;
        paVar28 = extraout_RDX_00;
        if ((psVar29->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) goto code_r0x001326c0;
        goto LAB_001326d7;
      }
    } while ((bVar8 != 0xc2) && (uVar35 = (uint)bVar8, (uVar35 & 0xfffffffe) != 0xc0));
  }
  j->progressive = (uint)(bVar8 == 0xc2);
  psVar29 = j->s;
  local_108 = (stbi__uint32 *)x;
  local_100 = (stbi__uint32 *)y;
  sVar7 = stbi__get8(psVar29);
  sVar9 = stbi__get8(psVar29);
  paVar28 = extraout_RDX_02;
  if (CONCAT11(sVar7,sVar9) < 0xb) {
LAB_00132743:
    pcVar20 = "bad SOF len";
    goto LAB_001327fb;
  }
  sVar10 = stbi__get8(psVar29);
  if (sVar10 != '\b') {
    pcVar20 = "only 8-bit";
    paVar28 = extraout_RDX_03;
    goto LAB_001327fb;
  }
  sVar10 = stbi__get8(psVar29);
  sVar11 = stbi__get8(psVar29);
  psVar29->img_y = (uint)CONCAT11(sVar10,sVar11);
  if (CONCAT11(sVar10,sVar11) == 0) {
    pcVar20 = "no header height";
    paVar28 = extraout_RDX_04;
    goto LAB_001327fb;
  }
  sVar10 = stbi__get8(psVar29);
  sVar11 = stbi__get8(psVar29);
  psVar29->img_x = (uint)CONCAT11(sVar10,sVar11);
  paVar28 = extraout_RDX_05;
  if (CONCAT11(sVar10,sVar11) == 0) {
    pcVar20 = "0 width";
    goto LAB_001327fb;
  }
  if (0x1000000 < psVar29->img_y) {
LAB_001327d9:
    pcVar20 = "too large";
    goto LAB_001327fb;
  }
  bVar8 = stbi__get8(psVar29);
  paVar28 = extraout_RDX_06;
  if (4 < bVar8) {
LAB_001329a9:
    pcVar20 = "bad component count";
    goto LAB_001327fb;
  }
  psVar44 = (stbi__context *)(ulong)bVar8;
  if ((0x1aU >> (bVar8 & 0x1f) & 1) == 0) goto LAB_001329a9;
  psVar29->img_n = (uint)bVar8;
  if (bVar8 != 0) {
    paVar28 = (anon_struct_96_18_0d0905d3 *)0x0;
    do {
      *(undefined8 *)((long)&j->img_comp[0].data + (long)paVar28) = 0;
      *(undefined8 *)((long)&j->img_comp[0].linebuf + (long)paVar28) = 0;
      paVar28 = paVar28 + 1;
    } while ((anon_struct_96_18_0d0905d3 *)((ulong)bVar8 * 0x60) != paVar28);
  }
  if (CONCAT11(sVar7,sVar9) != (ushort)((ushort)bVar8 + (ushort)bVar8 * 2 + 8)) goto LAB_00132743;
  j->rgb = 0;
  if (bVar8 != 0) {
    piVar42 = &j->img_comp[0].tq;
    lVar19 = 0;
    do {
      bVar8 = stbi__get8(psVar29);
      ((anon_struct_96_18_0d0905d3 *)(piVar42 + -3))->id = (uint)bVar8;
      if ((psVar29->img_n == 3) && (bVar8 == (&stbi__process_frame_header_rgb)[lVar19])) {
        j->rgb = j->rgb + 1;
      }
      bVar8 = stbi__get8(psVar29);
      piVar42[-2] = (uint)(bVar8 >> 4);
      paVar28 = extraout_RDX_07;
      if ((byte)(bVar8 + 0xb0) < 0xc0) goto LAB_00133aae;
      piVar42[-1] = bVar8 & 0xf;
      if ((bVar8 & 0xf) - 5 < 0xfffffffc) goto LAB_00133aba;
      bVar8 = stbi__get8(psVar29);
      *piVar42 = (uint)bVar8;
      if (3 < bVar8) {
        pcVar20 = "bad TQ";
        paVar28 = extraout_RDX_08;
        goto LAB_001327fb;
      }
      lVar19 = lVar19 + 1;
      psVar44 = (stbi__context *)(long)psVar29->img_n;
      piVar42 = piVar42 + 0x18;
    } while (lVar19 < (long)psVar44);
  }
  sVar3 = psVar29->img_x;
  b = psVar29->img_y;
  iVar16 = (int)psVar44;
  iVar15 = stbi__mad3sizes_valid(sVar3,b,iVar16,0);
  paVar28 = extraout_RDX_09;
  if (iVar15 == 0) goto LAB_001327d9;
  if (iVar16 < 1) {
    uVar43 = 1;
    uVar32 = 1;
  }
  else {
    uVar32 = 1;
    lVar19 = 0;
    uVar43 = 1;
    do {
      uVar35 = *(uint *)((long)&j->img_comp[0].h + lVar19);
      uVar37 = *(uint *)((long)&j->img_comp[0].v + lVar19);
      if ((int)uVar43 < (int)uVar35) {
        uVar43 = (ulong)uVar35;
      }
      if ((int)uVar32 < (int)uVar37) {
        uVar32 = (ulong)uVar37;
      }
      lVar19 = lVar19 + 0x60;
    } while (((ulong)psVar44 & 0xffffffff) * 0x60 != lVar19);
  }
  iVar17 = (int)uVar43;
  iVar15 = (int)uVar32;
  if (0 < iVar16) {
    lVar19 = 0;
    do {
      uVar21 = (long)iVar17 % (long)*(int *)((long)&j->img_comp[0].h + lVar19);
      paVar28 = (anon_struct_96_18_0d0905d3 *)(uVar21 & 0xffffffff);
      if ((int)uVar21 != 0) goto LAB_00133aae;
      uVar21 = (long)iVar15 % (long)*(int *)((long)&j->img_comp[0].v + lVar19);
      paVar28 = (anon_struct_96_18_0d0905d3 *)(uVar21 & 0xffffffff);
      if ((int)uVar21 != 0) goto LAB_00133aba;
      lVar19 = lVar19 + 0x60;
    } while (((ulong)psVar44 & 0xffffffff) * 0x60 != lVar19);
  }
  uVar37 = ((sVar3 + iVar17 * 8) - 1) / (uint)(iVar17 * 8);
  uVar35 = ((b + iVar15 * 8) - 1) / (uint)(iVar15 * 8);
  j->img_h_max = iVar17;
  j->img_v_max = iVar15;
  j->img_mcu_w = iVar17 * 8;
  j->img_mcu_h = iVar15 * 8;
  local_190 = (ulong)uVar37;
  j->img_mcu_x = uVar37;
  j->img_mcu_y = uVar35;
  if (0 < iVar16) {
    uVar21 = (ulong)psVar44 & 0xffffffff;
    iVar16 = 1;
    psVar44 = (stbi__context *)0x0;
    do {
      iVar40 = *(int *)((long)&j->img_comp[0].h + (long)psVar44);
      iVar26 = *(int *)((long)&j->img_comp[0].v + (long)psVar44);
      *(int *)((long)&j->img_comp[0].x + (long)psVar44) =
           (int)((iVar40 * sVar3 + iVar17 + -1) / uVar43);
      *(int *)((long)&j->img_comp[0].y + (long)psVar44) = (int)((iVar26 * b + iVar15 + -1) / uVar32)
      ;
      iVar40 = iVar40 * uVar37;
      iVar38 = iVar40 * 8;
      *(int *)((long)&j->img_comp[0].w2 + (long)psVar44) = iVar38;
      iVar26 = iVar26 * uVar35;
      iVar36 = iVar26 * 8;
      *(int *)((long)&j->img_comp[0].h2 + (long)psVar44) = iVar36;
      pvVar22 = stbi__malloc_mad2(iVar38,iVar36,0xf);
      puVar25 = (undefined8 *)((long)&j->img_comp[0].raw_coeff + (long)psVar44);
      *puVar25 = 0;
      puVar25[1] = 0;
      *(undefined8 *)((long)&j->img_comp[0].coeff + (long)psVar44) = 0;
      *(void **)((long)&j->img_comp[0].raw_data + (long)psVar44) = pvVar22;
      iVar18 = extraout_EDX_00;
      if (pvVar22 == (void *)0x0) {
LAB_00133ac6:
        *(char **)(in_FS_OFFSET + -8) = "outofmem";
        stbi__free_jpeg_components(j,iVar16,iVar18);
        uVar35 = extraout_EDX_05;
        goto LAB_00132804;
      }
      *(ulong *)((long)&j->img_comp[0].data + (long)psVar44) =
           (long)pvVar22 + 0xfU & 0xfffffffffffffff0;
      if (j->progressive != 0) {
        *(int *)((long)&j->img_comp[0].coeff_w + (long)psVar44) = iVar40;
        *(int *)((long)&j->img_comp[0].coeff_h + (long)psVar44) = iVar26;
        pvVar22 = stbi__malloc_mad3(iVar38,iVar36,2,0xf);
        *(void **)((long)&j->img_comp[0].raw_coeff + (long)psVar44) = pvVar22;
        iVar18 = extraout_EDX_01;
        if (pvVar22 == (void *)0x0) goto LAB_00133ac6;
        *(ulong *)((long)&j->img_comp[0].coeff + (long)psVar44) =
             (long)pvVar22 + 0xfU & 0xfffffffffffffff0;
      }
      iVar16 = iVar16 + 1;
      psVar44 = (stbi__context *)(psVar44->buffer_start + 0x28);
    } while ((stbi__context *)(uVar21 * 0x60) != psVar44);
  }
  bVar8 = stbi__get_marker(j);
  uVar37 = (uint)bVar8;
  uVar30 = extraout_RDX_10;
LAB_00132bf8:
  uVar35 = (uint)uVar30;
  if (uVar37 == 0xda) {
    psVar29 = j->s;
    bVar12 = stbi__get8(psVar29);
    sVar7 = stbi__get8(psVar29);
    bVar8 = stbi__get8(j->s);
    j->scan_n = (uint)bVar8;
    if (((byte)(bVar8 - 5) < 0xfc) || (j->s->img_n < (int)(uint)bVar8)) {
      pcVar20 = "bad SOS component count";
      paVar28 = extraout_RDX_14;
      goto LAB_001327fb;
    }
    paVar28 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)CONCAT11(bVar12,sVar7);
    if ((uint)CONCAT11(bVar12,sVar7) != (uint)bVar8 * 2 + 6) {
      pcVar20 = "bad SOS len";
      goto LAB_001327fb;
    }
    if (bVar8 != 0) {
      lVar19 = 0;
      do {
        bVar12 = stbi__get8(j->s);
        bVar8 = stbi__get8(j->s);
        uVar35 = j->s->img_n;
        if ((int)uVar35 < 1) {
          uVar32 = 0;
        }
        else {
          uVar32 = 0;
          paVar28 = paVar1;
          do {
            if (paVar28->id == (uint)bVar12) goto LAB_00132d43;
            uVar32 = uVar32 + 1;
            paVar28 = paVar28 + 1;
          } while (uVar35 != uVar32);
          uVar32 = (ulong)uVar35;
        }
LAB_00132d43:
        if ((uint)uVar32 == uVar35) goto LAB_00132804;
        uVar43 = uVar32 & 0xffffffff;
        paVar28 = (anon_struct_96_18_0d0905d3 *)(uVar43 * 0x60);
        j->img_comp[uVar43].hd = (uint)(bVar8 >> 4);
        if (0x3f < bVar8) {
          pcVar20 = "bad DC huff";
          goto LAB_001327fb;
        }
        paVar28 = paVar1 + uVar43;
        paVar28->ha = bVar8 & 0xf;
        if (3 < (bVar8 & 0xf)) {
          pcVar20 = "bad AC huff";
          goto LAB_001327fb;
        }
        j->order[lVar19] = (uint)uVar32;
        lVar19 = lVar19 + 1;
      } while (lVar19 < j->scan_n);
    }
    uVar37 = (uint)bVar12;
    bVar8 = stbi__get8(j->s);
    j->spec_start = (uint)bVar8;
    bVar8 = stbi__get8(j->s);
    j->spec_end = (uint)bVar8;
    bVar8 = stbi__get8(j->s);
    j->succ_high = (uint)(bVar8 >> 4);
    uVar35 = bVar8 & 0xf;
    paVar28 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar35;
    j->succ_low = uVar35;
    iVar15 = j->progressive;
    iVar16 = j->spec_start;
    if (iVar15 == 0) {
      if (((iVar16 == 0) && (bVar8 < 0x10)) && ((bVar8 & 0xf) == 0)) {
        j->spec_end = 0x3f;
        goto LAB_00132e6d;
      }
    }
    else if (((iVar16 < 0x40) && (j->spec_end < 0x40)) &&
            ((iVar16 <= j->spec_end && ((bVar8 < 0xe0 && (uVar35 < 0xe)))))) {
LAB_00132e6d:
      iVar16 = j->scan_n;
      psVar29 = (stbi__context *)(ulong)(uint)j->restart_interval;
      if (j->restart_interval == 0) {
        psVar29 = (stbi__context *)0x7fffffff;
      }
      j->code_buffer = 0;
      j->code_bits = 0;
      j->nomore = 0;
      j->img_comp[3].dc_pred = 0;
      j->img_comp[2].dc_pred = 0;
      j->img_comp[1].dc_pred = 0;
      j->img_comp[0].dc_pred = 0;
      j->marker = 0xff;
      uVar35 = (uint)psVar29;
      j->todo = uVar35;
      j->eob_run = 0;
      if (iVar15 == 0) {
        if (iVar16 == 1) {
          iVar15 = j->order[0];
          psVar44 = (stbi__context *)((long)iVar15 * 0x60);
          iVar16 = j->img_comp[iVar15].y + 7 >> 3;
          local_170 = 1;
          if (0 < iVar16) {
            psVar44 = (stbi__context *)((long)&paVar1->id + (long)&psVar44->img_x);
            uVar41 = *(int *)((long)&(psVar44->io).skip + 4) + 7 >> 3;
            uVar37 = 0;
            local_1a4 = 0;
            do {
              if (0 < (int)uVar41) {
                lVar19 = 0;
                do {
                  iVar17 = *(int *)((long)&(psVar44->io).read + 4);
                  iVar17 = stbi__jpeg_decode_block
                                     (j,local_f8,j->huff_dc + *(int *)&(psVar44->io).read,
                                      j->huff_ac + iVar17,j->fast_ac[iVar17],iVar15,
                                      j->dequant[psVar44->img_out_n]);
                  if (iVar17 == 0) {
                    bVar46 = false;
                    local_190 = 0;
                    psVar29 = extraout_RDX_17;
                  }
                  else {
                    iVar17 = *(int *)((long)&(psVar44->io).eof + 4);
                    (*j->idct_block_kernel)
                              ((stbi_uc *)
                               (*(long *)&psVar44->read_from_callbacks +
                               lVar19 + (int)(uVar37 * iVar17)),iVar17,local_f8);
                    iVar17 = j->todo;
                    j->todo = iVar17 + -1;
                    bVar46 = true;
                    psVar29 = extraout_RDX_18;
                    if (iVar17 < 2) {
                      if (j->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(j);
                        psVar29 = extraout_RDX_19;
                      }
                      if ((j->marker & 0xf8) == 0xd0) {
                        j->code_buffer = 0;
                        j->code_bits = 0;
                        j->nomore = 0;
                        j->img_comp[3].dc_pred = 0;
                        j->img_comp[2].dc_pred = 0;
                        j->img_comp[1].dc_pred = 0;
                        j->img_comp[0].dc_pred = 0;
                        j->marker = 0xff;
                        iVar17 = j->restart_interval;
                        psVar29 = (stbi__context *)0x7fffffff;
                        if (iVar17 == 0) {
                          iVar17 = 0x7fffffff;
                        }
                        j->todo = iVar17;
                        j->eob_run = 0;
                      }
                      else {
                        local_190 = 1;
                        bVar46 = false;
                      }
                    }
                  }
                  uVar35 = (uint)psVar29;
                  if (!bVar46) {
                    local_170 = (int)local_190;
                    goto LAB_001339e5;
                  }
                  lVar19 = lVar19 + 8;
                } while ((ulong)uVar41 * 8 != lVar19);
              }
              uVar35 = (uint)psVar29;
              local_1a4 = local_1a4 + 1;
              uVar37 = uVar37 + 8;
            } while (local_1a4 != iVar16);
          }
        }
        else {
          local_170 = 1;
          if (0 < j->img_mcu_y) {
            local_1a4 = 0;
            do {
              if (0 < j->img_mcu_x) {
                local_190 = 0;
                do {
                  if (0 < j->scan_n) {
                    lVar19 = 0;
                    do {
                      iVar15 = j->order[lVar19];
                      if (0 < j->img_comp[iVar15].v) {
                        iVar16 = 0;
                        bVar46 = true;
                        do {
                          iVar17 = paVar1[iVar15].h;
                          if (0 < iVar17) {
                            psVar44 = (stbi__context *)0x0;
                            do {
                              uVar37 = paVar1[iVar15].v;
                              iVar40 = stbi__jpeg_decode_block
                                                 (j,local_f8,j->huff_dc + paVar1[iVar15].hd,
                                                  j->huff_ac + paVar1[iVar15].ha,
                                                  j->fast_ac[paVar1[iVar15].ha],iVar15,
                                                  j->dequant[paVar1[iVar15].tq]);
                              uVar35 = (uint)extraout_RDX_21;
                              if (iVar40 == 0) {
                                psVar29 = extraout_RDX_21;
                                if (!bVar46) goto LAB_001338f8;
                                local_170 = 0;
                                goto LAB_001339e5;
                              }
                              uVar37 = (uVar37 * local_1a4 + iVar16) * paVar1[iVar15].w2 * 8;
                              (*j->idct_block_kernel)
                                        (paVar1[iVar15].data +
                                         (long)((iVar17 * (int)local_190 + (int)psVar44) * 8) +
                                         (long)(int)uVar37,paVar1[iVar15].w2,local_f8);
                              uVar35 = (int)psVar44 + 1;
                              psVar44 = (stbi__context *)(ulong)uVar35;
                              iVar17 = paVar1[iVar15].h;
                              psVar29 = extraout_RDX_22;
                            } while ((int)uVar35 < iVar17);
                          }
                          iVar16 = iVar16 + 1;
                          bVar46 = iVar16 < paVar1[iVar15].v;
                        } while (iVar16 < paVar1[iVar15].v);
                      }
LAB_001338f8:
                      lVar19 = lVar19 + 1;
                    } while (lVar19 < j->scan_n);
                  }
                  uVar35 = (uint)psVar29;
                  iVar15 = j->todo;
                  j->todo = iVar15 + -1;
                  if (iVar15 < 2) {
                    if (j->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(j);
                      uVar35 = extraout_EDX_04;
                    }
                    if ((j->marker & 0xf8) != 0xd0) goto LAB_001339e5;
                    j->code_buffer = 0;
                    j->code_bits = 0;
                    j->nomore = 0;
                    j->img_comp[3].dc_pred = 0;
                    j->img_comp[2].dc_pred = 0;
                    j->img_comp[1].dc_pred = 0;
                    j->img_comp[0].dc_pred = 0;
                    j->marker = 0xff;
                    iVar15 = j->restart_interval;
                    psVar29 = (stbi__context *)0x7fffffff;
                    if (iVar15 == 0) {
                      iVar15 = 0x7fffffff;
                    }
                    j->todo = iVar15;
                    j->eob_run = 0;
                  }
                  uVar35 = (int)local_190 + 1;
                  local_190 = (ulong)uVar35;
                } while ((int)uVar35 < j->img_mcu_x);
              }
              uVar35 = (uint)psVar29;
              local_1a4 = local_1a4 + 1;
            } while (local_1a4 < j->img_mcu_y);
          }
        }
      }
      else if (iVar16 == 1) {
        local_110 = (long)j->order[0];
        iVar15 = j->img_comp[local_110].y + 7 >> 3;
        if (0 < iVar15) {
          paVar28 = paVar1 + local_110;
          iVar17 = j->img_comp[local_110].x + 7 >> 3;
          iVar16 = 0;
          local_118 = paVar28;
          do {
            if (0 < iVar17) {
              iVar40 = 0;
              do {
                psVar33 = paVar28->coeff + (paVar28->coeff_w * iVar16 + iVar40) * 0x40;
                uVar32 = (ulong)j->spec_start;
                if (uVar32 == 0) {
                  iVar26 = stbi__jpeg_decode_block_prog_dc
                                     (j,psVar33,j->huff_dc + paVar28->hd,(int)local_110);
                  psVar29 = extraout_RDX_15;
                  if (iVar26 != 0) goto LAB_001331eb;
                  uVar37 = 0;
                  psVar44 = (stbi__context *)0x0;
                }
                else {
                  iVar26 = paVar28->ha;
                  iVar18 = j->eob_run;
                  bVar8 = (byte)j->succ_low;
                  if (j->succ_high == 0) {
                    if (iVar18 == 0) {
                      do {
                        if (j->code_bits < 0x10) {
                          stbi__grow_buffer_unsafe(j);
                        }
                        sVar2 = j->fast_ac[iVar26][j->code_buffer >> 0x17];
                        uVar35 = (uint)sVar2;
                        iVar18 = (int)uVar32;
                        if (sVar2 == 0) {
                          uVar35 = stbi__jpeg_huff_decode(j,j->huff_ac + iVar26);
                          if ((int)uVar35 < 0) goto LAB_0013336a;
                          uVar37 = uVar35 >> 4;
                          if ((uVar35 & 0xf) == 0) {
                            if (0xef < uVar35) {
                              uVar32 = (ulong)(iVar18 + 0x10);
                              goto LAB_001333bd;
                            }
                            j->eob_run = 1 << ((byte)uVar37 & 0x1f);
                            if (0xf < uVar35) {
                              iVar18 = stbi__jpeg_get_bits(j,uVar37);
                              j->eob_run = j->eob_run + iVar18;
                            }
                            j->eob_run = j->eob_run + -1;
                            iVar18 = 2;
                            goto LAB_0013337f;
                          }
                          uVar32 = (ulong)((int)((long)iVar18 + (ulong)uVar37) + 1);
                          bVar12 = ""[(long)iVar18 + (ulong)uVar37];
                          iVar18 = stbi__extend_receive(j,uVar35 & 0xf);
                          psVar33[bVar12] = (short)(iVar18 << (bVar8 & 0x1f));
LAB_001333bd:
                          iVar18 = 0;
                          bVar46 = true;
                        }
                        else {
                          uVar41 = iVar18 + (uVar35 >> 4 & 0xf);
                          uVar32 = (ulong)uVar41;
                          uVar37 = uVar35 & 0xf;
                          if ((int)uVar37 <= j->code_bits) {
                            j->code_buffer = j->code_buffer << (sbyte)uVar37;
                            j->code_bits = j->code_bits - uVar37;
                            uVar32 = (ulong)(uVar41 + 1);
                            psVar33[""[(int)uVar41]] = (short)((uVar35 >> 8) << (bVar8 & 0x1f));
                            goto LAB_001333bd;
                          }
LAB_0013336a:
                          *(char **)(in_FS_OFFSET + -8) = "bad huffman code";
                          iVar18 = 1;
LAB_0013337f:
                          bVar46 = false;
                        }
                        psVar29 = (stbi__context *)0x0;
                        bVar6 = true;
                        if (iVar18 != 0) {
                          if (iVar18 != 2) {
                            bVar6 = bVar46;
                          }
                          break;
                        }
                      } while ((int)uVar32 <= j->spec_end);
                    }
                    else {
                      j->eob_run = iVar18 + -1;
                      psVar29 = (stbi__context *)0x1;
                      bVar6 = false;
                    }
                    if (bVar6) goto LAB_001331cd;
                  }
                  else {
                    if (iVar18 == 0) {
                      iVar18 = 0x10000 << (bVar8 & 0x1f);
                      do {
                        uVar35 = stbi__jpeg_huff_decode(j,j->huff_ac + iVar26);
                        if ((int)uVar35 < 0) {
LAB_001330f4:
                          *(char **)(in_FS_OFFSET + -8) = "bad huffman code";
                          bVar46 = false;
                        }
                        else {
                          uVar37 = uVar35 >> 4;
                          if ((uVar35 & 0xf) == 1) {
                            iVar38 = stbi__jpeg_get_bit(j);
                            iVar36 = 1;
                            if (iVar38 == 0) {
                              iVar36 = 0xffff;
                            }
                            local_190 = (ulong)(uint)(iVar36 << (bVar8 & 0x1f));
                          }
                          else {
                            if ((uVar35 & 0xf) != 0) goto LAB_001330f4;
                            if (uVar35 < 0xf0) {
                              j->eob_run = ~(-1 << ((byte)uVar37 & 0x1f));
                              uVar41 = 0x40;
                              if (0xf < uVar35) {
                                iVar36 = stbi__jpeg_get_bits(j,uVar37);
                                j->eob_run = j->eob_run + iVar36;
                              }
                            }
                            else {
                              uVar41 = 0xf;
                            }
                            uVar37 = uVar41;
                            local_190 = 0;
                          }
                          uVar32 = (ulong)(int)uVar32;
                          do {
                            if ((long)j->spec_end < (long)uVar32) break;
                            bVar12 = ""[uVar32];
                            if (psVar33[bVar12] == 0) {
                              if (uVar37 == 0) {
                                psVar33[bVar12] = (short)local_190;
                                bVar46 = false;
                                uVar37 = 0;
                              }
                              else {
                                uVar37 = uVar37 - 1;
                                bVar46 = true;
                              }
                            }
                            else {
                              iVar36 = stbi__jpeg_get_bit(j);
                              bVar46 = true;
                              if ((iVar36 != 0) &&
                                 (sVar2 = psVar33[bVar12], (iVar18 >> 0x10 & (int)sVar2) == 0)) {
                                sVar5 = (short)((uint)iVar18 >> 0x10);
                                if (sVar2 < 1) {
                                  sVar5 = -sVar5;
                                }
                                psVar33[bVar12] = sVar2 + sVar5;
                              }
                            }
                            uVar32 = uVar32 + 1;
                          } while (bVar46);
                          bVar46 = true;
                        }
                        if (!bVar46) {
                          psVar29 = (stbi__context *)0x0;
                          goto LAB_001331d2;
                        }
                      } while ((int)uVar32 <= j->spec_end);
                    }
                    else {
                      j->eob_run = iVar18 + -1;
                      if (j->spec_start <= j->spec_end) {
                        uVar35 = (0x10000 << (bVar8 & 0x1f)) >> 0x10;
                        do {
                          bVar8 = ""[uVar32];
                          if (((psVar33[bVar8] != 0) &&
                              (iVar26 = stbi__jpeg_get_bit(j), iVar26 != 0)) &&
                             (sVar2 = psVar33[bVar8], (uVar35 & (int)sVar2) == 0)) {
                            uVar37 = -uVar35;
                            if (0 < sVar2) {
                              uVar37 = uVar35;
                            }
                            psVar33[bVar8] = (short)uVar37 + sVar2;
                          }
                          bVar46 = (long)uVar32 < (long)j->spec_end;
                          uVar32 = uVar32 + 1;
                        } while (bVar46);
                      }
                    }
LAB_001331cd:
                    psVar29 = (stbi__context *)0x1;
                  }
LAB_001331d2:
                  psVar44 = (stbi__context *)((ulong)psVar44 & 0xffffffff);
                  paVar28 = local_118;
                  if ((int)psVar29 == 0) {
                    uVar37 = 0;
                    psVar44 = psVar29;
                  }
                  else {
LAB_001331eb:
                    iVar26 = j->todo;
                    j->todo = iVar26 + -1;
                    uVar37 = 1;
                    if (iVar26 < 2) {
                      if (j->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(j);
                        psVar29 = extraout_RDX_16;
                      }
                      if ((j->marker & 0xf8) == 0xd0) {
                        j->code_buffer = 0;
                        j->code_bits = 0;
                        j->nomore = 0;
                        j->img_comp[3].dc_pred = 0;
                        j->img_comp[2].dc_pred = 0;
                        j->img_comp[1].dc_pred = 0;
                        j->img_comp[0].dc_pred = 0;
                        j->marker = 0xff;
                        iVar26 = j->restart_interval;
                        psVar29 = (stbi__context *)0x7fffffff;
                        if (iVar26 == 0) {
                          iVar26 = 0x7fffffff;
                        }
                        j->todo = iVar26;
                        j->eob_run = 0;
                      }
                      else {
                        uVar37 = 0;
                        psVar44 = (stbi__context *)0x1;
                      }
                    }
                  }
                }
                uVar35 = (uint)psVar29;
                if ((char)uVar37 == '\0') {
                  local_170 = (int)psVar44;
                  goto LAB_001339e5;
                }
                iVar40 = iVar40 + 1;
              } while (iVar40 != iVar17);
            }
            uVar35 = (uint)psVar29;
            iVar16 = iVar16 + 1;
          } while (iVar16 != iVar15);
        }
        local_170 = 1;
      }
      else {
        if (0 < j->img_mcu_y) {
          iVar15 = 0;
          do {
            if (0 < j->img_mcu_x) {
              iVar16 = 0;
              do {
                if (0 < j->scan_n) {
                  uVar32 = 0;
                  do {
                    local_190 = uVar32;
                    iVar17 = j->order[local_190];
                    if (0 < j->img_comp[iVar17].v) {
                      uVar37 = 0;
                      bVar46 = true;
                      do {
                        iVar40 = paVar1[iVar17].h;
                        if (0 < iVar40) {
                          psVar44 = (stbi__context *)0x0;
                          do {
                            iVar40 = stbi__jpeg_decode_block_prog_dc
                                               (j,paVar1[iVar17].coeff +
                                                  (int)((iVar40 * iVar16 + (int)psVar44 +
                                                        (paVar1[iVar17].v * iVar15 + uVar37) *
                                                        paVar1[iVar17].coeff_w) * 0x40),
                                                j->huff_dc + paVar1[iVar17].hd,iVar17);
                            uVar35 = (uint)extraout_RDX_20;
                            psVar29 = extraout_RDX_20;
                            if (iVar40 == 0) {
                              if (!bVar46) goto LAB_001336ce;
                              local_170 = 0;
                              goto LAB_001339e5;
                            }
                            uVar35 = (int)psVar44 + 1;
                            psVar44 = (stbi__context *)(ulong)uVar35;
                            iVar40 = paVar1[iVar17].h;
                          } while ((int)uVar35 < iVar40);
                        }
                        uVar37 = uVar37 + 1;
                        bVar46 = (int)uVar37 < paVar1[iVar17].v;
                      } while ((int)uVar37 < paVar1[iVar17].v);
                    }
LAB_001336ce:
                    uVar32 = local_190 + 1;
                  } while ((long)(local_190 + 1) < (long)j->scan_n);
                }
                uVar35 = (uint)psVar29;
                iVar17 = j->todo;
                j->todo = iVar17 + -1;
                if (iVar17 < 2) {
                  if (j->code_bits < 0x18) {
                    stbi__grow_buffer_unsafe(j);
                    uVar35 = extraout_EDX_03;
                  }
                  if ((j->marker & 0xf8) != 0xd0) goto LAB_00133791;
                  j->code_buffer = 0;
                  j->code_bits = 0;
                  j->nomore = 0;
                  j->img_comp[3].dc_pred = 0;
                  j->img_comp[2].dc_pred = 0;
                  j->img_comp[1].dc_pred = 0;
                  j->img_comp[0].dc_pred = 0;
                  j->marker = 0xff;
                  iVar17 = j->restart_interval;
                  psVar29 = (stbi__context *)0x7fffffff;
                  if (iVar17 == 0) {
                    iVar17 = 0x7fffffff;
                  }
                  j->todo = iVar17;
                  j->eob_run = 0;
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 < j->img_mcu_x);
            }
            uVar35 = (uint)psVar29;
            iVar15 = iVar15 + 1;
          } while (iVar15 < j->img_mcu_y);
        }
LAB_00133791:
        local_170 = 1;
      }
LAB_001339e5:
      if (local_170 == 0) goto LAB_00132804;
      if (j->marker == 0xff) {
        do {
          psVar29 = j->s;
          if ((psVar29->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00133a17:
            if (psVar29->img_buffer_end <= psVar29->img_buffer) {
LAB_00133a8a:
              uVar14 = 0xff;
              break;
            }
          }
          else {
            iVar15 = (*(psVar29->io).eof)(psVar29->io_user_data);
            if (iVar15 != 0) {
              if (psVar29->read_from_callbacks != 0) goto LAB_00133a17;
              goto LAB_00133a8a;
            }
          }
          bVar8 = stbi__get8(j->s);
          uVar35 = (uint)bVar8;
          do {
            cVar13 = (char)uVar35;
            uVar35 = uVar37;
            if (cVar13 != -1) break;
            psVar44 = j->s;
            if ((psVar44->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00133a53:
              if (psVar44->img_buffer_end <= psVar44->img_buffer) {
LAB_00133a76:
                uVar35 = 0xff;
                break;
              }
            }
            else {
              iVar15 = (*(psVar44->io).eof)(psVar44->io_user_data);
              if (iVar15 != 0) {
                if (psVar44->read_from_callbacks != 0) goto LAB_00133a53;
                goto LAB_00133a76;
              }
            }
            bVar8 = stbi__get8(j->s);
            uVar35 = (uint)bVar8;
          } while (0xfd < (byte)(bVar8 - 1));
          uVar37 = uVar35;
          uVar14 = (uchar)uVar37;
        } while (cVar13 != -1);
        j->marker = uVar14;
      }
      bVar8 = stbi__get_marker(j);
      uVar37 = (uint)bVar8;
      uVar30 = extraout_RDX_23;
      if ((bVar8 & 0xf8) == 0xd0) goto LAB_00132c28;
      goto LAB_00132bf8;
    }
    pcVar20 = "bad SOS";
    goto LAB_001327fb;
  }
  if (uVar37 == 0xdc) {
    psVar29 = j->s;
    sVar7 = stbi__get8(psVar29);
    sVar9 = stbi__get8(psVar29);
    psVar44 = (stbi__context *)(ulong)(uint)CONCAT11(sVar7,sVar9);
    psVar29 = j->s;
    sVar10 = stbi__get8(psVar29);
    sVar11 = stbi__get8(psVar29);
    if (CONCAT11(sVar7,sVar9) == 4) {
      if ((uint)CONCAT11(sVar10,sVar11) != j->s->img_y) {
        pcVar20 = "bad DNL height";
        goto LAB_00132e2e;
      }
      bVar8 = stbi__get_marker(j);
      uVar37 = (uint)bVar8;
      bVar46 = true;
      uVar30 = extraout_RDX_13;
    }
    else {
      pcVar20 = "bad DNL len";
LAB_00132e2e:
      *(char **)(in_FS_OFFSET + -8) = pcVar20;
      uVar37 = 0xdc;
      bVar46 = false;
      uVar30 = extraout_RDX_12;
    }
    uVar35 = (uint)uVar30;
    if (!bVar46) goto LAB_00132804;
    goto LAB_00132bf8;
  }
  if (uVar37 != 0xd9) {
    iVar15 = stbi__process_marker(j,uVar37);
    uVar35 = extraout_EDX_02;
    if (iVar15 == 0) goto LAB_00133c05;
LAB_00132c28:
    bVar8 = stbi__get_marker(j);
    uVar37 = (uint)bVar8;
    uVar30 = extraout_RDX_11;
    goto LAB_00132bf8;
  }
  if ((j->progressive != 0) && (0 < j->s->img_n)) {
    lVar19 = 0;
    do {
      iVar15 = j->img_comp[lVar19].y + 7 >> 3;
      if (0 < iVar15) {
        uVar35 = paVar1[lVar19].x + 7 >> 3;
        iVar16 = 0;
        do {
          if (0 < (int)uVar35) {
            uVar32 = 0;
            do {
              psVar33 = paVar1[lVar19].coeff +
                        (paVar1[lVar19].coeff_w * iVar16 + (int)uVar32) * 0x40;
              iVar17 = paVar1[lVar19].tq;
              lVar34 = 0;
              do {
                psVar33[lVar34] = psVar33[lVar34] * j->dequant[iVar17][lVar34];
                lVar34 = lVar34 + 1;
              } while (lVar34 != 0x40);
              (*j->idct_block_kernel)
                        (paVar1[lVar19].data + uVar32 * 8 + (long)(iVar16 * 8 * paVar1[lVar19].w2),
                         paVar1[lVar19].w2,psVar33);
              uVar32 = uVar32 + 1;
              uVar30 = extraout_RDX_24;
            } while (uVar32 != uVar35);
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 != iVar15);
      }
      uVar35 = (uint)uVar30;
      lVar19 = lVar19 + 1;
    } while (lVar19 < j->s->img_n);
  }
LAB_00133c05:
  uVar37 = j->s->img_n;
  if ((ulong)uVar37 == 3) {
    bVar46 = true;
    if (j->rgb != 3) {
      if (j->app14_color_transform != 0) goto LAB_00133c2d;
      bVar46 = j->jfif == 0;
    }
  }
  else {
LAB_00133c2d:
    bVar46 = false;
  }
  if ((int)uVar37 < 1) goto LAB_0013280d;
  local_138[2] = (stbi_uc *)0x0;
  lStack_120 = 0;
  local_138[0] = (stbi_uc *)0x0;
  local_138[1] = (stbi_uc *)0x0;
  lVar19 = (ulong)uVar37 * 0x30;
  pvVar22 = (void *)0x0;
  lVar34 = 0;
  do {
    psVar29 = j->s;
    sVar3 = psVar29->img_x;
    pvVar23 = malloc((ulong)(sVar3 + 3));
    *(void **)((long)&j->img_comp[0].linebuf + lVar34 * 2) = pvVar23;
    if (pvVar23 == (void *)0x0) {
      stbi__free_jpeg_components(j,psVar29->img_n,why);
      *(char **)(in_FS_OFFSET + -8) = "outofmem";
    }
    else {
      uVar32 = (long)j->img_h_max / (long)*(int *)((long)&j->img_comp[0].h + lVar34 * 2);
      iVar15 = (int)uVar32;
      *(int *)((long)local_e0 + lVar34) = iVar15;
      iVar16 = j->img_v_max / *(int *)((long)&j->img_comp[0].v + lVar34 * 2);
      *(int *)((long)local_e0 + lVar34 + 4) = iVar16;
      *(int *)((long)local_e0 + lVar34 + 0xc) = iVar16 >> 1;
      *(int *)((long)local_e0 + lVar34 + 8) =
           (int)((ulong)((sVar3 + iVar15) - 1) / (uVar32 & 0xffffffff));
      *(undefined4 *)((long)local_e0 + lVar34 + 0x10) = 0;
      uVar30 = *(undefined8 *)((long)&j->img_comp[0].data + lVar34 * 2);
      *(undefined8 *)((long)local_f0 + lVar34 + 8) = uVar30;
      *(undefined8 *)((long)local_f0 + lVar34) = uVar30;
      if ((iVar15 == 1) && (iVar16 == 1)) {
        pcVar24 = resample_row_1;
      }
      else if ((iVar15 == 1) && (iVar16 == 2)) {
        pcVar24 = stbi__resample_row_v_2;
      }
      else if ((iVar15 == 2) && (iVar16 == 1)) {
        pcVar24 = stbi__resample_row_h_2;
      }
      else if ((iVar15 == 2) && (iVar16 == 2)) {
        pcVar24 = j->resample_row_hv_2_kernel;
      }
      else {
        pcVar24 = stbi__resample_row_generic;
      }
      *(code **)((long)local_f8 + lVar34) = pcVar24;
    }
    if (pvVar23 == (void *)0x0) goto LAB_00132815;
    lVar34 = lVar34 + 0x30;
  } while (lVar19 != lVar34);
  psVar29 = j->s;
  sVar3 = psVar29->img_y;
  pvVar22 = stbi__malloc_mad3(4,psVar29->img_x,sVar3,1);
  if (pvVar22 != (void *)0x0) {
    iVar15 = why_00;
    if (sVar3 != 0) {
      iVar16 = 0;
      uVar35 = 0;
      do {
        sVar3 = psVar29->img_x;
        ppsVar45 = local_138;
        lVar34 = 0;
        do {
          puVar25 = (undefined8 *)((long)local_f0 + lVar34 + 8);
          iVar15 = *(int *)((long)local_e0 + lVar34 + 0xc);
          iVar17 = *(int *)((long)local_e0 + lVar34 + 4);
          iVar40 = iVar17 >> 1;
          puVar27 = puVar25;
          if (iVar15 < iVar40) {
            puVar27 = (undefined8 *)((long)local_f0 + lVar34);
          }
          if (iVar40 <= iVar15) {
            puVar25 = (undefined8 *)((long)local_f0 + lVar34);
          }
          auVar47 = (**(code **)((long)local_f8 + lVar34))
                              (*(undefined8 *)((long)&j->img_comp[0].linebuf + lVar34 * 2),*puVar27,
                               *puVar25,*(undefined4 *)((long)local_e0 + lVar34 + 8),
                               *(undefined4 *)((long)local_e0 + lVar34));
          psVar31 = auVar47._8_8_;
          *ppsVar45 = auVar47._0_8_;
          *(int *)((long)local_e0 + lVar34 + 0xc) = iVar15 + 1;
          if (iVar17 <= iVar15 + 1) {
            *(undefined4 *)((long)local_e0 + lVar34 + 0xc) = 0;
            lVar4 = *(long *)((long)local_f0 + lVar34 + 8);
            *(long *)((long)local_f0 + lVar34) = lVar4;
            iVar15 = *(int *)((long)local_e0 + lVar34 + 0x10) + 1;
            *(int *)((long)local_e0 + lVar34 + 0x10) = iVar15;
            if (iVar15 < *(int *)((long)&j->img_comp[0].y + lVar34 * 2)) {
              *(long *)((long)local_f0 + lVar34 + 8) =
                   lVar4 + *(int *)((long)&j->img_comp[0].w2 + lVar34 * 2);
            }
          }
          lVar34 = lVar34 + 0x30;
          ppsVar45 = ppsVar45 + 1;
        } while (lVar19 != lVar34);
        psVar39 = (stbi_uc *)((ulong)(uVar35 * sVar3 * 4) + (long)pvVar22);
        psVar29 = j->s;
        if (psVar29->img_n == 3) {
          if (bVar46) {
            if (psVar29->img_x != 0) {
              uVar37 = sVar3 * iVar16;
              uVar32 = 0;
              do {
                *(stbi_uc *)((long)pvVar22 + uVar32 * 4 + (ulong)uVar37) = local_138[0][uVar32];
                *(stbi_uc *)((long)pvVar22 + uVar32 * 4 + (ulong)uVar37 + 1) = local_138[1][uVar32];
                *(stbi_uc *)((long)pvVar22 + uVar32 * 4 + (ulong)uVar37 + 2) = local_138[2][uVar32];
                *(undefined1 *)((long)pvVar22 + uVar32 * 4 + (ulong)uVar37 + 3) = 0xff;
                uVar32 = uVar32 + 1;
                psVar31 = local_138[2];
              } while (uVar32 < psVar29->img_x);
            }
          }
          else {
LAB_00134024:
            (*j->YCbCr_to_RGB_kernel)
                      (psVar39,local_138[0],local_138[1],local_138[2],psVar29->img_x,4);
            psVar31 = extraout_RDX_25;
          }
        }
        else if (psVar29->img_n == 4) {
          if (j->app14_color_transform == 2) {
            (*j->YCbCr_to_RGB_kernel)
                      (psVar39,local_138[0],local_138[1],local_138[2],psVar29->img_x,4);
            psVar29 = j->s;
            psVar31 = extraout_RDX_26;
            if (psVar29->img_x != 0) {
              uVar37 = sVar3 * iVar16;
              psVar31 = (stbi_uc *)0x0;
              do {
                bVar8 = psVar31[lStack_120];
                iVar15 = (*(byte *)((long)pvVar22 + (long)psVar31 * 4 + (ulong)uVar37) ^ 0xff) *
                         (uint)bVar8;
                *(char *)((long)pvVar22 + (long)psVar31 * 4 + (ulong)uVar37) =
                     (char)((iVar15 + 0x80U >> 8) + iVar15 + 0x80 >> 8);
                iVar15 = (*(byte *)((long)pvVar22 + (long)psVar31 * 4 + (ulong)uVar37 + 1) ^ 0xff) *
                         (uint)bVar8;
                *(char *)((long)pvVar22 + (long)psVar31 * 4 + (ulong)uVar37 + 1) =
                     (char)(iVar15 + (iVar15 + 0x80U >> 8) + 0x80 >> 8);
                iVar15 = (*(byte *)((long)pvVar22 + (long)psVar31 * 4 + (ulong)uVar37 + 2) ^ 0xff) *
                         (uint)bVar8;
                *(char *)((long)pvVar22 + (long)psVar31 * 4 + (ulong)uVar37 + 2) =
                     (char)(iVar15 + (iVar15 + 0x80U >> 8) + 0x80 >> 8);
                psVar31 = psVar31 + 1;
              } while (psVar31 < (stbi_uc *)(ulong)psVar29->img_x);
            }
          }
          else {
            if (j->app14_color_transform != 0) goto LAB_00134024;
            if (psVar29->img_x != 0) {
              uVar37 = sVar3 * iVar16;
              psVar39 = (stbi_uc *)0x0;
              do {
                bVar8 = psVar39[lStack_120];
                iVar15 = (uint)local_138[0][(long)psVar39] * (uint)bVar8;
                *(char *)((long)pvVar22 + (long)psVar39 * 4 + (ulong)uVar37) =
                     (char)((iVar15 + 0x80U >> 8) + iVar15 + 0x80 >> 8);
                iVar15 = (uint)local_138[1][(long)psVar39] * (uint)bVar8;
                *(char *)((long)pvVar22 + (long)psVar39 * 4 + (ulong)uVar37 + 1) =
                     (char)(iVar15 + (iVar15 + 0x80U >> 8) + 0x80 >> 8);
                *(char *)((long)pvVar22 + (long)psVar39 * 4 + (ulong)uVar37 + 2) =
                     (char)((uint)local_138[2][(long)psVar39] * (uint)bVar8 +
                            ((uint)local_138[2][(long)psVar39] * (uint)bVar8 + 0x80 >> 8) + 0x80 >>
                           8);
                *(undefined1 *)((long)pvVar22 + (long)psVar39 * 4 + (ulong)uVar37 + 3) = 0xff;
                psVar39 = psVar39 + 1;
                psVar31 = (stbi_uc *)(ulong)psVar29->img_x;
              } while (psVar39 < psVar31);
            }
          }
        }
        else if (psVar29->img_x != 0) {
          uVar32 = (ulong)(sVar3 * iVar16);
          psVar39 = (stbi_uc *)0x0;
          do {
            sVar7 = local_138[0][(long)psVar39];
            *(stbi_uc *)((long)pvVar22 + (long)psVar39 * 4 + uVar32 + 2) = sVar7;
            *(stbi_uc *)((long)pvVar22 + (long)psVar39 * 4 + uVar32 + 1) = sVar7;
            *(stbi_uc *)((long)pvVar22 + (long)psVar39 * 4 + uVar32) = sVar7;
            *(undefined1 *)((long)pvVar22 + (long)psVar39 * 4 + uVar32 + 3) = 0xff;
            psVar39 = psVar39 + 1;
            psVar31 = (stbi_uc *)(ulong)psVar29->img_x;
          } while (psVar39 < psVar31);
        }
        iVar15 = (int)psVar31;
        uVar35 = uVar35 + 1;
        psVar29 = j->s;
        iVar16 = iVar16 + 4;
      } while (uVar35 < psVar29->img_y);
    }
    stbi__free_jpeg_components(j,psVar29->img_n,iVar15);
    psVar29 = j->s;
    *local_108 = psVar29->img_x;
    *local_100 = psVar29->img_y;
    if (comp != (int *)0x0) {
      *comp = (uint)(2 < psVar29->img_n) * 2 + 1;
    }
    goto LAB_00132815;
  }
  stbi__free_jpeg_components(j,psVar29->img_n,why_00);
  *(char **)(in_FS_OFFSET + -8) = "outofmem";
  goto LAB_00132812;
code_r0x001326c0:
  iVar15 = (*(psVar29->io).eof)(psVar29->io_user_data);
  if (iVar15 != 0) {
    paVar28 = extraout_RDX_01;
    if (psVar29->read_from_callbacks != 0) {
LAB_001326d7:
      if (psVar29->img_buffer < psVar29->img_buffer_end) goto LAB_001326aa;
    }
    pcVar20 = "no SOF";
    goto LAB_001327fb;
  }
  goto LAB_001326aa;
LAB_00133aae:
  pcVar20 = "bad H";
  goto LAB_001327fb;
LAB_00133aba:
  pcVar20 = "bad V";
LAB_001327fb:
  uVar35 = (uint)paVar28;
  *(char **)(in_FS_OFFSET + -8) = pcVar20;
LAB_00132804:
  uVar37 = j->s->img_n;
LAB_0013280d:
  stbi__free_jpeg_components(j,uVar37,uVar35);
LAB_00132812:
  pvVar22 = (void *)0x0;
LAB_00132815:
  free(j);
  return pvVar22;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}